

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void testGcSafePoints(void)

{
  HashTableEntry<unsigned_long,_bool> *pHVar1;
  MutatorThread thread2;
  MutatorThread thread1;
  Gc gc;
  Thread local_150;
  undefined1 local_140;
  Thread local_138;
  undefined1 local_128;
  Gc local_120;
  
  Gc::Gc(&local_120);
  g_gc = &local_120;
  puts("starting mutator threads...");
  local_138.m_isOpen = false;
  local_128 = 0;
  local_150.m_isOpen = false;
  local_140 = 0;
  axl::sys::psx::Thread::create
            (&local_138,(pthread_attr_t *)0x0,axl::sys::ThreadImpl<MutatorThread>::threadFunc,
             &local_138);
  axl::sys::psx::Thread::create
            (&local_150,(pthread_attr_t *)0x0,axl::sys::ThreadImpl<MutatorThread>::threadFunc,
             &local_150);
  Gc::registerThread(&local_120,local_138.m_threadId);
  Gc::registerThread(&local_120,local_150.m_threadId);
  axl::sys::sleep(1000);
  puts("stopping the world...");
  Gc::stopTheWorld(&local_120);
  puts("the world is stopped.");
  axl::sys::sleep(2000);
  puts("resuming the world...");
  Gc::resumeTheWorld(&local_120);
  axl::sys::sleep(1000);
  puts("stopping mutator threads...");
  local_128 = 1;
  axl::sys::ThreadImpl<MutatorThread>::waitAndClose
            ((ThreadImpl<MutatorThread> *)&local_138,0xffffffff);
  local_128 = 0;
  local_140 = 1;
  axl::sys::ThreadImpl<MutatorThread>::waitAndClose
            ((ThreadImpl<MutatorThread> *)&local_150,0xffffffff);
  local_140 = 0;
  puts("done.");
  g_gc = (Gc *)0x0;
  axl::sys::ThreadImpl<MutatorThread>::~ThreadImpl((ThreadImpl<MutatorThread> *)&local_150);
  axl::sys::ThreadImpl<MutatorThread>::~ThreadImpl((ThreadImpl<MutatorThread> *)&local_138);
  sem_destroy((sem_t *)&local_120.m_handshakeSem);
  axl::sl::
  ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
  ::release(&local_120.m_threadMap.m_table.
             super_ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::HashTableEntry<unsigned_long,_bool>::GetBucketLink>_>_>
           );
  if (local_120.m_threadMap.m_list.
      super_OwningListBase<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::HashTableEntry<unsigned_long,_bool>_>_>
      .
      super_ListBase<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>_>
      .super_ListData<axl::sl::HashTableEntry<unsigned_long,_bool>_>.m_head !=
      (HashTableEntry<unsigned_long,_bool> *)0x0) {
    do {
      pHVar1 = (HashTableEntry<unsigned_long,_bool> *)
               ((local_120.m_threadMap.m_list.
                 super_OwningListBase<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::HashTableEntry<unsigned_long,_bool>_>_>
                 .
                 super_ListBase<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>_>
                 .super_ListData<axl::sl::HashTableEntry<unsigned_long,_bool>_>.m_head)->
               super_MapEntry<unsigned_long,_bool>).super_ListLink.m_next;
      operator_delete(local_120.m_threadMap.m_list.
                      super_OwningListBase<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::HashTableEntry<unsigned_long,_bool>_>_>
                      .
                      super_ListBase<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>_>
                      .super_ListData<axl::sl::HashTableEntry<unsigned_long,_bool>_>.m_head);
      local_120.m_threadMap.m_list.
      super_OwningListBase<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::HashTableEntry<unsigned_long,_bool>_>_>
      .
      super_ListBase<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>_>
      .super_ListData<axl::sl::HashTableEntry<unsigned_long,_bool>_>.m_head = pHVar1;
    } while (pHVar1 != (HashTableEntry<unsigned_long,_bool> *)0x0);
    local_120.m_threadMap.m_list.
    super_OwningListBase<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::HashTableEntry<unsigned_long,_bool>_>_>
    .
    super_ListBase<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>_>
    .super_ListData<axl::sl::HashTableEntry<unsigned_long,_bool>_>.m_head =
         (HashTableEntry<unsigned_long,_bool> *)0x0;
    local_120.m_threadMap.m_list.
    super_OwningListBase<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::HashTableEntry<unsigned_long,_bool>_>_>
    .
    super_ListBase<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>_>
    .super_ListData<axl::sl::HashTableEntry<unsigned_long,_bool>_>.m_tail =
         (HashTableEntry<unsigned_long,_bool> *)0x0;
    local_120.m_threadMap.m_list.
    super_OwningListBase<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sl::HashTableEntry<unsigned_long,_bool>_>_>
    .
    super_ListBase<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ImplicitPtrCast<axl::sl::HashTableEntry<unsigned_long,_bool>,_axl::sl::ListLink>_>_>
    .super_ListData<axl::sl::HashTableEntry<unsigned_long,_bool>_>.m_count = 0;
  }
  axl::sl::ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>::release
            (&local_120.m_threadArray.
              super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>);
  axl::io::psx::Mapping::~Mapping(&local_120.m_guardPage);
  return;
}

Assistant:

void
testGcSafePoints() {
	Gc gc;

	g_gc = &gc;

	printf("starting mutator threads...\n");

	MutatorThread thread1;
	MutatorThread thread2;

	thread1.start();
	thread2.start();

	gc.registerThread(thread1.getThreadId());
	gc.registerThread(thread2.getThreadId());

	sys::sleep(1000);

	printf("stopping the world...\n");
	gc.stopTheWorld();
	printf("the world is stopped.\n");

	sys::sleep(2000);

	printf("resuming the world...\n");
	gc.resumeTheWorld();

	sys::sleep(1000);

	printf("stopping mutator threads...\n");

	thread1.stop();
	thread2.stop();

	printf("done.\n");

	g_gc = NULL;
}